

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEquiv.c
# Opt level: O2

void Gia_ManEquivTransform(Gia_Man_t *p,int fVerbose)

{
  int iVar1;
  int iVar2;
  Vec_Int_t *p_00;
  Vec_Int_t *p_01;
  Gia_Obj_t *pGVar3;
  uint Id;
  ulong uVar4;
  int i;
  uint uVar5;
  long lVar6;
  uint local_48;
  uint local_40;
  uint local_3c;
  
  if ((p->pReprs == (Gia_Rpr_t *)0x0) || (p->pNexts == (int *)0x0)) {
    __assert_fail("p->pReprs && p->pNexts",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                  ,0x5bb,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
  }
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_IntAlloc(100);
  lVar6 = 0;
  do {
    uVar4 = (ulong)p->nObjs;
    if ((long)uVar4 <= lVar6) {
LAB_001e7a35:
      local_3c = 0;
      local_48 = 0;
      uVar5 = 0;
      local_40 = 0;
      while( true ) {
        do {
          if ((int)uVar4 < 2) {
            Vec_IntFree(p_00);
            Vec_IntFree(p_01);
            if (fVerbose != 0) {
              Abc_Print(1,
                        "Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n"
                        ,(ulong)local_48,(ulong)local_40,(ulong)local_3c,(ulong)uVar5);
              return;
            }
            return;
          }
          Id = (int)uVar4 - 1;
          uVar4 = (ulong)Id;
          iVar1 = Gia_ObjIsHead(p,Id);
        } while (iVar1 == 0);
        p_00->nSize = 0;
        p_01->nSize = 0;
        iVar1 = Gia_ObjIsHead(p,Id);
        if (iVar1 == 0) break;
        local_40 = local_40 + 1;
        for (; 0 < (int)Id; Id = p->pNexts[Id]) {
          Vec_IntPush(p_00,Id);
          if ((uint)p->pReprs[Id] >> 0x1e == 3) {
            local_3c = local_3c + 1;
          }
          else {
            if ((uint)p->pReprs[Id] >> 0x1e == 0) {
              __assert_fail("Gia_ObjColors(p, iNode)",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                            ,0x5ca,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
            }
            Vec_IntPush(p_01,Id);
          }
          uVar5 = uVar5 + 1;
        }
        iVar1 = p_00->nSize;
        i = 0;
        if (iVar1 < 1) {
          iVar1 = 0;
        }
        for (; iVar1 != i; i = i + 1) {
          iVar2 = Vec_IntEntry(p_00,i);
          p->pReprs[iVar2] = (Gia_Rpr_t)((uint)p->pReprs[iVar2] & 0xefffffff);
          p->pReprs[iVar2] = (Gia_Rpr_t)((uint)p->pReprs[iVar2] & 0xdfffffff);
          p->pReprs[iVar2] = (Gia_Rpr_t)((uint)p->pReprs[iVar2] | 0xfffffff);
          p->pNexts[iVar2] = 0;
        }
        if (p_01->nSize < 2) {
          local_48 = local_48 + 1;
        }
        else {
          Cec_ManSimClassCreate(p,p_01);
        }
      }
      __assert_fail("Gia_ObjIsHead(p, iRepr)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x5c6,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
    }
    pGVar3 = Gia_ManObj(p,(int)lVar6);
    if (pGVar3 == (Gia_Obj_t *)0x0) {
      uVar4 = (ulong)(uint)p->nObjs;
      goto LAB_001e7a35;
    }
    uVar5 = (uint)*(undefined8 *)pGVar3;
    if ((((~uVar5 & 0x9fffffff) == 0) || ((~uVar5 & 0x1fffffff) != 0 && -1 < (int)uVar5)) &&
       ((uint)p->pReprs[lVar6] < 0x40000000)) {
      __assert_fail("Gia_ObjColors(p, i)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaEquiv.c"
                    ,0x5c0,"void Gia_ManEquivTransform(Gia_Man_t *, int)");
    }
    lVar6 = lVar6 + 1;
  } while( true );
}

Assistant:

void Gia_ManEquivTransform( Gia_Man_t * p, int fVerbose )
{
    extern void Cec_ManSimClassCreate( Gia_Man_t * p, Vec_Int_t * vClass );
    Vec_Int_t * vClass, * vClassNew;
    int iRepr, iNode, Ent, k;
    int nRemovedLits = 0, nRemovedClas = 0;
    int nTotalLits = 0, nTotalClas = 0;
    Gia_Obj_t * pObj;
    int i;
    assert( p->pReprs && p->pNexts );
    vClass = Vec_IntAlloc( 100 );
    vClassNew = Vec_IntAlloc( 100 );
    Gia_ManForEachObj( p, pObj, i )
        if ( Gia_ObjIsCi(pObj) || Gia_ObjIsAnd(pObj) )
            assert( Gia_ObjColors(p, i) );
    Gia_ManForEachClassReverse( p, iRepr )
    {
        nTotalClas++;
        Vec_IntClear( vClass );
        Vec_IntClear( vClassNew );
        Gia_ClassForEachObj( p, iRepr, iNode )
        {
            nTotalLits++;
            Vec_IntPush( vClass, iNode );
            assert( Gia_ObjColors(p, iNode) );
            if ( Gia_ObjColors(p, iNode) != 3 )
                Vec_IntPush( vClassNew, iNode );
            else
                nRemovedLits++;
        }
        Vec_IntForEachEntry( vClass, Ent, k )
        {
            p->pReprs[Ent].fFailed = p->pReprs[Ent].fProved = 0;
            p->pReprs[Ent].iRepr = GIA_VOID;
            p->pNexts[Ent] = 0;
        }
        if ( Vec_IntSize(vClassNew) < 2 )
        {
            nRemovedClas++;
            continue;
        }
        Cec_ManSimClassCreate( p, vClassNew );
    }
    Vec_IntFree( vClass );
    Vec_IntFree( vClassNew );
    if ( fVerbose )
    Abc_Print( 1, "Removed classes = %6d (out of %6d). Removed literals = %6d (out of %6d).\n",
        nRemovedClas, nTotalClas, nRemovedLits, nTotalLits );
}